

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

bool anon_unknown.dwarf_1c2549::checkPixels<half>
               (Array2D<unsigned_int> *sampleCount,Array2D<half_*> *ph,int lx,int rx,int ly,int ry,
               int width)

{
  long lVar1;
  float *pfVar2;
  float fVar3;
  short sVar4;
  bool bVar5;
  ushort uVar6;
  ostream *poVar7;
  long *plVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  bool bVar13;
  float fVar14;
  uif x;
  bool local_8b;
  
  local_8b = ry < ly;
  if (ly <= ry) {
    lVar9 = (long)ly;
    do {
      if (lx <= rx) {
        lVar10 = (long)lx;
        bVar5 = rx < lx;
        do {
          bVar13 = sampleCount->_data[sampleCount->_sizeY * lVar9 + lVar10] != 0;
          if (bVar13) {
            iVar11 = ((int)lVar9 * width + (int)lVar10) % 0x801;
            fVar14 = (float)iVar11;
            uVar12 = 0;
            do {
              fVar3 = *(float *)((long)&half::_toFloat +
                                (ulong)ph->_data[ph->_sizeY * lVar9 + lVar10][uVar12]._h * 4);
              uVar6 = (ushort)((uint)fVar14 >> 0x10);
              if (iVar11 != 0) {
                sVar4 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar14 >> 0x17) * 2);
                if (sVar4 == 0) {
                  uVar6 = half::convert((int)fVar14);
                }
                else {
                  uVar6 = sVar4 + (short)(((uint)fVar14 & 0x7fffff) + 0xfff +
                                          (uint)(((uint)fVar14 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              pfVar2 = (float *)((long)&half::_toFloat + (ulong)uVar6 * 4);
              if ((fVar3 != *pfVar2) || (NAN(fVar3) || NAN(*pfVar2))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar7 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
                poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)lVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", sample ",9);
                poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,": ",2);
                poVar7 = (ostream *)
                         operator<<(poVar7,(half)ph->_data[ph->_sizeY * lVar9 + lVar10][uVar12]._h);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,", should be ",0xc);
                plVar8 = (long *)std::ostream::operator<<(poVar7,iVar11);
                std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
                std::ostream::put((char)plVar8);
                std::ostream::flush();
                std::ostream::flush();
                if (bVar13) {
                  if (!bVar5) {
                    return local_8b;
                  }
                  goto LAB_001706ee;
                }
                break;
              }
              uVar12 = uVar12 + 1;
              bVar13 = uVar12 < sampleCount->_data[sampleCount->_sizeY * lVar9 + lVar10];
            } while (bVar13);
          }
          lVar1 = lVar10 + 1;
          bVar5 = rx <= lVar10;
          lVar10 = lVar1;
        } while (rx + 1 != (int)lVar1);
      }
LAB_001706ee:
      lVar10 = lVar9 + 1;
      local_8b = ry <= lVar9;
      lVar9 = lVar10;
    } while (ry + 1 != (int)lVar10);
  }
  return local_8b;
}

Assistant:

bool checkPixels (Array2D<unsigned int>& sampleCount, Array2D<T*> &ph,
                  int lx, int rx, int ly, int ry, int width)
{
    for (int y = ly; y <= ry; ++y)
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T>(((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i << ": " << ph[y][x][i]
                         << ", should be " << (y * width + x) % 2049 << endl << flush;
                    return false;
                }
            }
        }
    return true;
}